

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::PickerPrivate::initDrawOffsetForFirstUse(PickerPrivate *this)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int maxOffset;
  int freeItemsCount;
  PickerPrivate *this_local;
  
  if ((this->wasPainted & 1U) == 0) {
    iVar1 = Picker::count(this->q);
    if (iVar1 < this->itemsCount) {
      iVar1 = this->itemsCount;
      iVar2 = Picker::count(this->q);
      iVar1 = iVar1 - iVar2;
      if (iVar1 < 1) {
        local_2c = 0;
      }
      else {
        local_2c = iVar1 + -1;
      }
      this->drawItemOffset = (iVar1 * this->stringHeight + local_2c * this->itemTopMargin) / 2;
      this->wasPainted = true;
    }
  }
  return;
}

Assistant:

void
PickerPrivate::initDrawOffsetForFirstUse()
{
	if( !wasPainted && q->count() < itemsCount )
	{
		const int freeItemsCount = ( itemsCount - q->count() );

		const int maxOffset = freeItemsCount * stringHeight +
			( freeItemsCount > 0 ? freeItemsCount - 1 : 0 ) * itemTopMargin;

		drawItemOffset = maxOffset / 2;

		wasPainted = true;
	}
}